

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O0

int __thiscall TPZCheckMesh::CheckConnectSeqNumberConsistency(TPZCheckMesh *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int64_t iVar4;
  TPZConnect *this_00;
  int64_t iVar5;
  ostream *poVar6;
  void *this_01;
  undefined8 *in_RDI;
  int64_t seqnum;
  TPZConnect *c_1;
  int64_t ic_1;
  TPZConnect *c;
  int64_t ic;
  int64_t nconnect;
  int64_t numindepconnect;
  bool wrong;
  long local_40;
  TPZConnect *in_stack_ffffffffffffffc8;
  TPZChunkVector<TPZConnect,_10> *this_02;
  long local_20;
  int local_4;
  
  bVar1 = false;
  local_20 = 0;
  iVar4 = TPZCompMesh::NConnects((TPZCompMesh *)0x19f2188);
  for (this_02 = (TPZChunkVector<TPZConnect,_10> *)0x0; (long)this_02 < iVar4;
      this_02 = (TPZChunkVector<TPZConnect,_10> *)
                ((long)&(this_02->super_TPZSavable)._vptr_TPZSavable + 1)) {
    TPZCompMesh::ConnectVec((TPZCompMesh *)*in_RDI);
    in_stack_ffffffffffffffc8 =
         TPZChunkVector<TPZConnect,_10>::operator[](this_02,(int64_t)in_stack_ffffffffffffffc8);
    iVar3 = TPZConnect::HasDependency(in_stack_ffffffffffffffc8);
    if (((iVar3 == 0) && (iVar3 = TPZConnect::NElConnected(in_stack_ffffffffffffffc8), iVar3 != 0))
       && (bVar2 = TPZConnect::IsCondensed(in_stack_ffffffffffffffc8), !bVar2)) {
      local_20 = local_20 + 1;
    }
  }
  if (local_20 == 0) {
    local_4 = 0;
  }
  else {
    for (local_40 = 0; local_40 < iVar4; local_40 = local_40 + 1) {
      TPZCompMesh::ConnectVec((TPZCompMesh *)*in_RDI);
      this_00 = TPZChunkVector<TPZConnect,_10>::operator[]
                          (this_02,(int64_t)in_stack_ffffffffffffffc8);
      iVar3 = TPZConnect::HasDependency(this_00);
      if ((((iVar3 != 0) || (iVar3 = TPZConnect::NElConnected(this_00), iVar3 == 0)) ||
          (bVar2 = TPZConnect::IsCondensed(this_00), bVar2)) &&
         ((iVar5 = TPZConnect::SequenceNumber(this_00), iVar5 < local_20 && (iVar5 != -1)))) {
        poVar6 = std::operator<<((ostream *)in_RDI[1],"Connect index ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_40);
        poVar6 = std::operator<<(poVar6," has inconsistent sequence number ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
        poVar6 = std::operator<<(poVar6," nindependent connects ");
        this_01 = (void *)std::ostream::operator<<(poVar6,local_20);
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        bVar1 = true;
      }
    }
    if (bVar1) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int TPZCheckMesh::CheckConnectSeqNumberConsistency()
{
    bool wrong = false;
    int64_t numindepconnect = 0;
    int64_t nconnect = fMesh->NConnects();
    for (int64_t ic=0; ic<nconnect; ic++) {
        TPZConnect &c = fMesh->ConnectVec()[ic];
        if (!c.HasDependency() && c.NElConnected() && !c.IsCondensed()) {
            numindepconnect++;
        }
    }
    if (numindepconnect == 0) {
        return 0;
    }
    for (int64_t ic=0; ic<nconnect; ic++) {
        TPZConnect &c = fMesh->ConnectVec()[ic];
        if (c.HasDependency() || !c.NElConnected() || c.IsCondensed()) {
            int64_t seqnum = c.SequenceNumber();
            if (seqnum < numindepconnect && seqnum != -1) { // @omar need more information about this case seqnum != -1
                *fOut << "Connect index " << ic << " has inconsistent sequence number " << seqnum << " nindependent connects " << numindepconnect << std::endl;
                wrong = true;
            }
        }
    }
    if (wrong == false) {
        return 0;
    }
    else
    {
        return 1;
    }
}